

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeView.cc
# Opt level: O1

bool __thiscall NodeView::is_bubble_side(NodeView *this)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  vector<LinkView,_std::allocator<LinkView>_> n;
  vector<LinkView,_std::allocator<LinkView>_> p;
  vector<LinkView,_std::allocator<LinkView>_> local_a8;
  vector<LinkView,_std::allocator<LinkView>_> local_90;
  vector<NodeView,_std::allocator<NodeView>_> local_78;
  vector<LinkView,_std::allocator<LinkView>_> local_60;
  vector<LinkView,_std::allocator<LinkView>_> local_48;
  NodeView local_30;
  NodeView local_20;
  
  prev(&local_60,this);
  next(&local_a8,this);
  parallels(&local_78,this);
  if ((((long)local_78.super__Vector_base<NodeView,_std::allocator<NodeView>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_78.super__Vector_base<NodeView,_std::allocator<NodeView>_>._M_impl.
              super__Vector_impl_data._M_start == 0x10) &&
      ((long)local_60.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_60.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
             super__Vector_impl_data._M_start == 0x28)) &&
     ((long)local_a8.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_a8.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
            super__Vector_impl_data._M_start == 0x28)) {
    local_20.id = ((local_60.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
                    super__Vector_impl_data._M_start)->node_view).id;
    local_20.dg = ((local_60.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
                    super__Vector_impl_data._M_start)->node_view).dg;
    next(&local_90,&local_20);
    if ((long)local_90.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_90.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
              super__Vector_impl_data._M_start == 0x50) {
      local_30.id = ((local_a8.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
                      super__Vector_impl_data._M_start)->node_view).id;
      local_30.dg = ((local_a8.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
                      super__Vector_impl_data._M_start)->node_view).dg;
      prev(&local_48,&local_30);
      bVar3 = (long)local_48.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_48.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
                    super__Vector_impl_data._M_start == 0x50;
      bVar2 = true;
      bVar1 = true;
      goto LAB_001d19ea;
    }
    bVar2 = true;
  }
  else {
    bVar2 = false;
  }
  bVar1 = false;
  bVar3 = false;
LAB_001d19ea:
  if ((bVar1) &&
     (local_48.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0)) {
    operator_delete(local_48.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((bVar2) &&
     (local_90.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0)) {
    operator_delete(local_90.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_90.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_78.super__Vector_base<NodeView,_std::allocator<NodeView>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<NodeView,_std::allocator<NodeView>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<NodeView,_std::allocator<NodeView>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<NodeView,_std::allocator<NodeView>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_a8.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a8.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_60.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return bVar3;
}

Assistant:

bool NodeView::is_bubble_side() const {
    auto p=prev();
    auto n=next();
    if ( parallels().size()== 1 and p.size()==1 and n.size()==1 and p[0].node().next().size()==2 and n[0].node().prev().size()==2) {
        return true;
    }
    return false;
}